

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>
          (detail *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out,string_view bytes,basic_format_specs<char> *specs)

{
  size_t size;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  anon_class_16_1_a7b7af8b local_48;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  basic_format_specs<char> *local_30;
  basic_format_specs<char> *specs_local;
  string_view bytes_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  
  bytes_local.data_ = bytes.data_;
  local_38.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_30 = (basic_format_specs<char> *)bytes.size_;
  specs_local = (basic_format_specs<char> *)out.container;
  bytes_local.size_ = (size_t)this;
  size = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  local_48.bytes.data_ = (char *)specs_local;
  local_48.bytes.size_ = (size_t)bytes_local.data_;
  bVar1 = write_padded<(fmt::v7::align::type)1,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(char*)_1_>
                    (local_38,(basic_format_specs<char> *)bytes.size_,size,&local_48);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar1.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}